

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlExpandEntityInAttValue
               (xmlParserCtxtPtr ctxt,xmlSBuf *buf,xmlChar *str,xmlEntityPtr pent,int normalize,
               int *inSpace,int depth,int check)

{
  byte bVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlEntityPtr pent_00;
  xmlParserErrors code;
  uint len;
  char *pcVar4;
  byte *local_48;
  int local_3c;
  xmlSBuf *local_38;
  
  if (str != (xmlChar *)0x0) {
    iVar2 = 0x28;
    if ((ctxt->options & 0x80000) == 0) {
      iVar2 = 0x14;
    }
    local_48 = str;
    if (depth < iVar2) {
      if (pent != (xmlEntityPtr)0x0) {
        if ((pent->flags & 8) != 0) {
          xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
          xmlHaltParser(ctxt);
          return;
        }
        if ((check != 0) && (iVar2 = xmlParserEntityCheck(ctxt,(long)pent->length), iVar2 != 0)) {
          return;
        }
      }
      if (ctxt->disableSAX < 2) {
        local_3c = check;
        len = 0;
        local_38 = buf;
        do {
          bVar1 = *local_48;
          if (bVar1 == 0x26) {
            if (local_48[1] == 0x23) {
              if (0 < (int)len) {
                xmlSBufAddString(buf,local_48 + -(ulong)len,len);
                len = 0;
              }
              iVar2 = xmlParseStringCharRef(ctxt,&local_48);
              if (iVar2 == 0x20) {
                if ((normalize == 0) || (iVar2 = 1, *inSpace == 0)) {
                  iVar2 = 1;
                  xmlSBufAddString(buf," ",1);
                }
              }
              else {
                if (iVar2 == 0) goto LAB_001358d1;
                xmlSBufAddChar(buf,iVar2);
                iVar2 = 0;
              }
              *inSpace = iVar2;
            }
            else {
              if (0 < (int)len) {
                xmlSBufAddString(buf,local_48 + -(ulong)len,len);
                len = 0;
              }
              pxVar3 = xmlParseStringEntityRef(ctxt,&local_48);
              if (pxVar3 == (xmlChar *)0x0) {
LAB_001358d1:
                if (pent == (xmlEntityPtr)0x0) {
                  return;
                }
                *pent->content = '\0';
                return;
              }
              pent_00 = xmlLookupGeneralEntity(ctxt,pxVar3,1);
              (*xmlFree)(pxVar3);
              buf = local_38;
              if (pent_00 != (xmlEntityPtr)0x0) {
                pxVar3 = pent_00->content;
                if (pent_00->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
                  if (pxVar3 == (xmlChar *)0x0) {
                    pcVar4 = "predefined entity has no content\n";
                    code = XML_ERR_INTERNAL_ERROR;
                    goto LAB_0013582d;
                  }
                  xmlSBufAddString(local_38,pxVar3,pent_00->length);
                  *inSpace = 0;
                }
                else if (pxVar3 != (xmlChar *)0x0) {
                  if (pent == (xmlEntityPtr)0x0) {
                    xmlExpandEntityInAttValue
                              (ctxt,local_38,pxVar3,pent_00,normalize,inSpace,depth + 1,local_3c);
                  }
                  else {
                    *(byte *)&pent->flags = (byte)pent->flags | 8;
                    xmlExpandEntityInAttValue
                              (ctxt,local_38,pxVar3,pent_00,normalize,inSpace,depth + 1,local_3c);
                    *(byte *)&pent->flags = (byte)pent->flags & 0xf7;
                  }
                }
              }
            }
          }
          else {
            if (bVar1 == 0) break;
            if (bVar1 == 0x3c && pent != (xmlEntityPtr)0x0) {
              xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_LT_IN_ATTRIBUTE,XML_ERR_FATAL,
                         pent->name,(xmlChar *)0x0,(xmlChar *)0x0,0,
                         "\'<\' in entity \'%s\' is not allowed in attributes values\n",pent->name);
              break;
            }
            if (bVar1 < 0x21) {
              if ((normalize == 0) || (*inSpace == 0)) {
                if (bVar1 == 0x20) {
                  len = len + 1;
                  iVar2 = 1;
                }
                else {
                  if (0 < (int)len) {
                    xmlSBufAddString(buf,local_48 + -(ulong)len,len);
                    len = 0;
                  }
                  iVar2 = 1;
                  xmlSBufAddString(buf," ",1);
                }
              }
              else {
                iVar2 = 1;
                if (0 < (int)len) {
                  xmlSBufAddString(buf,local_48 + -(ulong)len,len);
                  len = 0;
                }
              }
            }
            else {
              len = len + 1;
              iVar2 = 0;
            }
            *inSpace = iVar2;
            local_48 = local_48 + 1;
          }
        } while (ctxt->disableSAX < 2);
        if (0 < (int)len) {
          xmlSBufAddString(buf,local_48 + -(ulong)len,len);
        }
      }
    }
    else {
      pcVar4 = "Maximum entity nesting depth exceeded";
      code = XML_ERR_RESOURCE_LIMIT;
LAB_0013582d:
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,(xmlChar *)0x0,
                 (xmlChar *)0x0,(xmlChar *)0x0,0,"%s",pcVar4);
    }
  }
  return;
}

Assistant:

static void
xmlExpandEntityInAttValue(xmlParserCtxtPtr ctxt, xmlSBuf *buf,
                          const xmlChar *str, xmlEntityPtr pent, int normalize,
                          int *inSpace, int depth, int check) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 40 : 20;
    int c, chunkSize;

    if (str == NULL)
        return;

    depth += 1;
    if (depth > maxDepth) {
	xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                       "Maximum entity nesting depth exceeded");
	return;
    }

    if (pent != NULL) {
        if (pent->flags & XML_ENT_EXPANDING) {
            xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
            xmlHaltParser(ctxt);
            return;
        }

        if (check) {
            if (xmlParserEntityCheck(ctxt, pent->length))
                return;
        }
    }

    chunkSize = 0;

    /*
     * Note that entity values are already validated. No special
     * handling for multi-byte characters is needed.
     */
    while (!PARSER_STOPPED(ctxt)) {
        c = *str;

	if (c != '&') {
            if (c == 0)
                break;

            /*
             * If this function is called without an entity, it is used to
             * expand entities in an attribute content where less-than was
             * already unscaped and is allowed.
             */
            if ((pent != NULL) && (c == '<')) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_LT_IN_ATTRIBUTE,
                        "'<' in entity '%s' is not allowed in attributes "
                        "values\n", pent->name);
                break;
            }

            if (c <= 0x20) {
                if ((normalize) && (*inSpace)) {
                    /* Skip char */
                    if (chunkSize > 0) {
                        xmlSBufAddString(buf, str - chunkSize, chunkSize);
                        chunkSize = 0;
                    }
                } else if (c < 0x20) {
                    if (chunkSize > 0) {
                        xmlSBufAddString(buf, str - chunkSize, chunkSize);
                        chunkSize = 0;
                    }

                    xmlSBufAddCString(buf, " ", 1);
                } else {
                    chunkSize += 1;
                }

                *inSpace = 1;
            } else {
                chunkSize += 1;
                *inSpace = 0;
            }

            str += 1;
        } else if (str[1] == '#') {
            int val;

            if (chunkSize > 0) {
                xmlSBufAddString(buf, str - chunkSize, chunkSize);
                chunkSize = 0;
            }

	    val = xmlParseStringCharRef(ctxt, &str);
	    if (val == 0) {
                if (pent != NULL)
                    pent->content[0] = 0;
                break;
            }

            if (val == ' ') {
                if ((!normalize) || (!*inSpace))
                    xmlSBufAddCString(buf, " ", 1);
                *inSpace = 1;
            } else {
                xmlSBufAddChar(buf, val);
                *inSpace = 0;
            }
	} else {
            xmlChar *name;
            xmlEntityPtr ent;

            if (chunkSize > 0) {
                xmlSBufAddString(buf, str - chunkSize, chunkSize);
                chunkSize = 0;
            }

	    name = xmlParseStringEntityRef(ctxt, &str);
            if (name == NULL) {
                if (pent != NULL)
                    pent->content[0] = 0;
                break;
            }

            ent = xmlLookupGeneralEntity(ctxt, name, /* inAttr */ 1);
            xmlFree(name);

	    if ((ent != NULL) &&
		(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
		if (ent->content == NULL) {
		    xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
			    "predefined entity has no content\n");
                    break;
                }

                xmlSBufAddString(buf, ent->content, ent->length);

                *inSpace = 0;
	    } else if ((ent != NULL) && (ent->content != NULL)) {
                if (pent != NULL)
                    pent->flags |= XML_ENT_EXPANDING;
		xmlExpandEntityInAttValue(ctxt, buf, ent->content, ent,
                                          normalize, inSpace, depth, check);
                if (pent != NULL)
                    pent->flags &= ~XML_ENT_EXPANDING;
	    }
        }
    }

    if (chunkSize > 0)
        xmlSBufAddString(buf, str - chunkSize, chunkSize);
}